

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

Vec_Int_t * Mop_ManCompatiblePairs(Vec_Int_t *vPairs,int nObjs)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  void *__s;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  iVar3 = 0x10;
  if (0xe < nObjs - 1U) {
    iVar3 = nObjs;
  }
  if (iVar3 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar3 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)nObjs << 2);
  }
  iVar3 = vPairs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar4;
  iVar3 = vPairs->nSize;
  if (0 < (long)iVar3) {
    piVar4 = vPairs->pArray;
    lVar6 = 0;
    do {
      iVar5 = piVar4[lVar6];
      if (((long)iVar5 < 0) || (nObjs <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar1 = (int *)((long)__s + (long)iVar5 * 4);
      *piVar1 = *piVar1 + 1;
      lVar6 = lVar6 + 1;
    } while (iVar3 != lVar6);
  }
  if (1 < vPairs->nSize) {
    lVar6 = 1;
    do {
      uVar7 = vPairs->pArray[lVar6 + -1];
      lVar9 = (long)(int)uVar7;
      if ((lVar9 < 0) || (nObjs <= (int)uVar7)) goto LAB_0033584c;
      uVar2 = vPairs->pArray[lVar6];
      iVar3 = *(int *)((long)__s + lVar9 * 4);
      if (iVar3 == 1) {
LAB_00335689:
        uVar8 = uVar7;
        uVar7 = uVar2;
LAB_0033568f:
        Vec_IntPush(p,uVar8);
        Vec_IntPush(p,uVar7);
        *(undefined4 *)((long)__s + lVar9 * 4) = 0xffffffff;
        if (((int)uVar2 < 0) || (nObjs <= (int)uVar2)) goto LAB_0033586b;
        *(undefined4 *)((long)__s + (ulong)uVar2 * 4) = 0xffffffff;
      }
      else {
        if (((int)uVar2 < 0) || (nObjs <= (int)uVar2)) goto LAB_0033584c;
        if (*(int *)((long)__s + (ulong)uVar2 * 4) == 1) {
          uVar8 = uVar2;
          if (iVar3 == 1) goto LAB_00335689;
          goto LAB_0033568f;
        }
      }
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 < vPairs->nSize);
  }
  if (1 < vPairs->nSize) {
    lVar6 = 1;
    do {
      iVar3 = vPairs->pArray[lVar6 + -1];
      lVar9 = (long)iVar3;
      if ((lVar9 < 0) || (nObjs <= iVar3)) goto LAB_0033584c;
      if (0 < *(int *)((long)__s + lVar9 * 4)) {
        uVar7 = vPairs->pArray[lVar6];
        if (((int)uVar7 < 0) || (nObjs <= (int)uVar7)) goto LAB_0033584c;
        if (0 < *(int *)((long)__s + (ulong)uVar7 * 4)) {
          Vec_IntPush(p,iVar3);
          Vec_IntPush(p,uVar7);
          *(undefined4 *)((long)__s + lVar9 * 4) = 0xffffffff;
          *(undefined4 *)((long)__s + (ulong)uVar7 * 4) = 0xffffffff;
        }
      }
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 < vPairs->nSize);
  }
  if (1 < vPairs->nSize) {
    lVar6 = 1;
    do {
      uVar7 = vPairs->pArray[lVar6 + -1];
      lVar9 = (long)(int)uVar7;
      if ((lVar9 < 0) || (nObjs <= (int)uVar7)) {
LAB_0033584c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar2 = vPairs->pArray[lVar6];
      iVar3 = *(int *)((long)__s + lVar9 * 4);
      if (iVar3 < 1) {
        if (((int)uVar2 < 0) || (nObjs <= (int)uVar2)) goto LAB_0033584c;
        if (0 < *(int *)((long)__s + (ulong)uVar2 * 4)) {
          uVar8 = uVar2;
          if (0 < iVar3) goto LAB_003357c2;
          goto LAB_003357c8;
        }
      }
      else {
LAB_003357c2:
        uVar8 = uVar7;
        uVar7 = uVar2;
LAB_003357c8:
        Vec_IntPush(p,uVar8);
        Vec_IntPush(p,uVar7);
        *(undefined4 *)((long)__s + lVar9 * 4) = 0xffffffff;
        if (((int)uVar2 < 0) || (nObjs <= (int)uVar2)) {
LAB_0033586b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)((long)__s + (ulong)uVar2 * 4) = 0xffffffff;
      }
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 < vPairs->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  return p;
}

Assistant:

Vec_Int_t * Mop_ManCompatiblePairs( Vec_Int_t * vPairs, int nObjs )
{
    int i, Entry, Entry2;
    Vec_Int_t * vCounts = Vec_IntStart( nObjs );
    Vec_Int_t * vPairsNew = Vec_IntAlloc( Vec_IntSize(vPairs) );
    Vec_IntForEachEntry( vPairs, Entry, i )
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    // include pairs which have those that appear only once
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) == 1 || Vec_IntEntry(vCounts, Entry2) == 1 )
        {
            if ( Vec_IntEntry(vCounts, Entry) == 1 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add those remaining pairs that are both present
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 && Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add remaining pairs
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 || Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            if ( Vec_IntEntry(vCounts, Entry) > 0 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    Vec_IntFree( vCounts );
    // verify the result
    if ( 0 )
    {
        Vec_Int_t * vTemp1 = Vec_IntDup( vPairs );
        Vec_Int_t * vTemp2 = Vec_IntDup( vPairsNew );
        Vec_IntUniqify( vTemp1 );
        Vec_IntUniqify( vTemp2 );
        assert( Vec_IntEqual( vTemp1, vTemp2 ) );
        Vec_IntFree( vTemp1 );
        Vec_IntFree( vTemp2 );
    }
    return vPairsNew;
}